

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O0

bool __thiscall
TPZPlane::Belongs(TPZPlane *this,TPZVec<double> *ponto1,TPZVec<double> *ponto2,
                 TPZVec<double> *ponto3)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  TPZVec<double> aux2;
  TPZVec<double> aux1;
  int i;
  int aux;
  int64_t in_stack_ffffffffffffff08;
  TPZVec<double> *in_stack_ffffffffffffff10;
  TPZVec<double> *in_stack_ffffffffffffff30;
  TPZPlane *in_stack_ffffffffffffff38;
  _func_int **pp_Var6;
  TPZVec<double> *in_stack_ffffffffffffff40;
  TPZVec<double> *in_stack_ffffffffffffff48;
  TPZVec<double> *in_stack_ffffffffffffff50;
  TPZVec<double> local_70;
  TPZVec<double> local_50;
  int local_30;
  uint local_2c;
  TPZVec<double> *local_28;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  byte local_1;
  
  local_2c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = Belongs(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_2c = (uint)bVar2;
  bVar3 = Belongs(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  iVar4 = (uint)bVar2 + (uint)bVar3;
  local_2c = iVar4;
  bVar2 = Belongs(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_2c = iVar4 + (uint)bVar2;
  TPZVec<double>::TPZVec(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  TPZVec<double>::TPZVec(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (local_2c == 3) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pdVar5 = TPZVec<double>::operator[](local_18,(long)local_30);
      in_stack_ffffffffffffff48 = (TPZVec<double> *)*pdVar5;
      in_stack_ffffffffffffff50 =
           (TPZVec<double> *)TPZVec<double>::operator[](local_20,(long)local_30);
      pp_Var6 = (_func_int **)
                (((double)in_stack_ffffffffffffff48 -
                 (double)in_stack_ffffffffffffff50->_vptr_TPZVec) * 100.0);
      in_stack_ffffffffffffff40 =
           (TPZVec<double> *)TPZVec<double>::operator[](&local_50,(long)local_30);
      in_stack_ffffffffffffff40->_vptr_TPZVec = pp_Var6;
      pdVar5 = TPZVec<double>::operator[](local_20,(long)local_30);
      dVar1 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](local_28,(long)local_30);
      in_stack_ffffffffffffff10 = (TPZVec<double> *)((dVar1 - *pdVar5) * 100.0);
      pdVar5 = TPZVec<double>::operator[](&local_70,(long)local_30);
      *pdVar5 = (double)in_stack_ffffffffffffff10;
    }
    local_2c = 0;
    TPZNumeric::ProdVetorial<double>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pdVar5 = TPZVec<double>::operator[](&local_50,(long)local_30);
      if (ABS(*pdVar5) < 9e-07) {
        local_2c = local_2c + 1;
      }
    }
    if (local_2c == 3) {
      std::operator<<((ostream *)&std::cout,
                      "TPZPlane::Belongs(p1, p2, p3) - Warning: The 3 input points are colinear\n");
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  TPZVec<double>::~TPZVec(in_stack_ffffffffffffff10);
  TPZVec<double>::~TPZVec(in_stack_ffffffffffffff10);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZPlane::Belongs(const TPZVec<REAL> &ponto1, const TPZVec<REAL> &ponto2, const TPZVec<REAL> &ponto3){
	int aux=0;
	int i;
	aux = aux + Belongs(ponto1);
	aux = aux + Belongs(ponto2);
	aux = aux + Belongs(ponto3);
	TPZVec<REAL> aux1(3), aux2(3);
    // Verify if the points are colinear
	if(aux==3) {
		for(i=0;i<3;i++) {
			aux1[i]=100.*(ponto1[i]-ponto2[i]);
			aux2[i]=100.*(ponto2[i]-ponto3[i]);
		}
		// Verify if the displacement vectors have the same direction
		aux=0;
		TPZNumeric::ProdVetorial(aux1, aux2, aux1);
		for(i=0;i<3;i++) {
			if(fabs(aux1[i])<0.0000009) aux++;
		}
		if(aux==3) {
			cout << "TPZPlane::Belongs(p1, p2, p3) - Warning: The 3 input points are colinear\n";
		}
		return true;
	}
	else return false;
}